

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.c
# Opt level: O1

float orient2dslow(float *pa,float *pb,float *pc)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float deter [16];
  float bxay [8];
  float axby [8];
  float local_88 [16];
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  
  fVar15 = *pa;
  fVar10 = pa[1];
  fVar12 = *pc;
  fVar14 = pc[1];
  fVar9 = fVar15 - fVar12;
  fVar8 = (fVar15 - (fVar9 + (fVar15 - fVar9))) + ((fVar15 - fVar9) - fVar12);
  fVar2 = fVar10 - fVar14;
  fVar4 = (fVar10 - (fVar2 + (fVar10 - fVar2))) + ((fVar10 - fVar2) - fVar14);
  fVar15 = *pb;
  fVar10 = pb[1];
  fVar3 = fVar15 - fVar12;
  fVar5 = (fVar15 - (fVar3 + (fVar15 - fVar3))) + ((fVar15 - fVar3) - fVar12);
  fVar6 = fVar10 - fVar14;
  fVar10 = (fVar10 - (fVar6 + (fVar10 - fVar6))) + ((fVar10 - fVar6) - fVar14);
  fVar13 = splitter * fVar8 - (splitter * fVar8 - fVar8);
  fVar12 = fVar8 - fVar13;
  fVar16 = splitter * fVar10 - (splitter * fVar10 - fVar10);
  fVar15 = fVar10 - fVar16;
  fVar14 = fVar8 * fVar10;
  local_28 = fVar12 * fVar15 - (((fVar14 - fVar13 * fVar16) - fVar12 * fVar16) - fVar13 * fVar15);
  fVar11 = fVar9 * splitter - (fVar9 * splitter - fVar9);
  fVar10 = fVar10 * fVar9;
  fVar8 = fVar8 * fVar6;
  fVar7 = fVar6 * fVar9;
  fVar9 = fVar9 - fVar11;
  fVar16 = fVar15 * fVar9 - (((fVar10 - fVar11 * fVar16) - fVar16 * fVar9) - fVar11 * fVar15);
  fVar15 = fVar14 + fVar16;
  fVar16 = (fVar14 - (fVar15 - (fVar15 - fVar14))) + (fVar16 - (fVar15 - fVar14));
  fVar14 = fVar10 + fVar15;
  fVar15 = fVar15 - (fVar14 - fVar10);
  fVar10 = splitter * fVar6 - (splitter * fVar6 - fVar6);
  fVar6 = fVar6 - fVar10;
  fVar13 = fVar12 * fVar6 - (((fVar8 - fVar13 * fVar10) - fVar12 * fVar10) - fVar13 * fVar6);
  fVar12 = fVar13 + fVar16;
  local_24 = (fVar16 - (fVar12 - (fVar12 - fVar16))) + (fVar13 - (fVar12 - fVar16));
  fVar13 = fVar15 + fVar12;
  fVar15 = (fVar15 - (fVar13 - (fVar13 - fVar15))) + (fVar12 - (fVar13 - fVar15));
  fVar16 = fVar14 + fVar13;
  fVar13 = (fVar14 - (fVar16 - (fVar16 - fVar14))) + (fVar13 - (fVar16 - fVar14));
  fVar12 = fVar6 * fVar9 - (((fVar7 - fVar11 * fVar10) - fVar10 * fVar9) - fVar11 * fVar6);
  fVar10 = fVar8 + fVar12;
  fVar14 = (fVar8 - (fVar10 - (fVar10 - fVar8))) + (fVar12 - (fVar10 - fVar8));
  fVar12 = fVar14 + fVar15;
  local_20 = (fVar15 - (fVar12 - (fVar12 - fVar15))) + (fVar14 - (fVar12 - fVar15));
  fVar14 = fVar13 + fVar12;
  fVar9 = (fVar13 - (fVar14 - (fVar14 - fVar13))) + (fVar12 - (fVar14 - fVar13));
  fVar15 = fVar16 + fVar14;
  fVar6 = (fVar16 - (fVar15 - (fVar15 - fVar16))) + (fVar14 - (fVar15 - fVar16));
  fVar12 = fVar7 + fVar10;
  fVar14 = (fVar7 - (fVar12 - (fVar12 - fVar7))) + (fVar10 - (fVar12 - fVar7));
  fVar10 = fVar14 + fVar9;
  local_1c = (fVar9 - (fVar10 - (fVar10 - fVar9))) + (fVar14 - (fVar10 - fVar9));
  fVar14 = fVar6 + fVar10;
  fVar9 = (fVar6 - (fVar14 - (fVar14 - fVar6))) + (fVar10 - (fVar14 - fVar6));
  fVar10 = fVar15 + fVar14;
  fVar15 = (fVar15 - (fVar10 - (fVar10 - fVar15))) + (fVar14 - (fVar10 - fVar15));
  fVar14 = fVar12 + fVar9;
  local_18 = (fVar9 - (fVar14 - (fVar14 - fVar9))) + (fVar12 - (fVar14 - fVar9));
  fVar12 = fVar15 + fVar14;
  local_14 = (fVar15 - (fVar12 - (fVar12 - fVar15))) + (fVar14 - (fVar12 - fVar15));
  local_c = fVar10 + fVar12;
  local_10 = (fVar10 - (local_c - (local_c - fVar10))) + (fVar12 - (local_c - fVar10));
  fVar6 = -fVar2;
  fVar8 = -fVar4;
  fVar14 = splitter * fVar5 - (splitter * fVar5 - fVar5);
  fVar12 = fVar5 - fVar14;
  fVar7 = splitter * fVar8 - (fVar4 + splitter * fVar8);
  fVar15 = fVar8 - fVar7;
  fVar10 = fVar5 * fVar8;
  local_48 = fVar12 * fVar15 - (((fVar10 - fVar14 * fVar7) - fVar12 * fVar7) - fVar14 * fVar15);
  fVar9 = fVar3 * splitter - (fVar3 * splitter - fVar3);
  fVar8 = fVar8 * fVar3;
  fVar5 = fVar5 * fVar6;
  fVar4 = fVar6 * fVar3;
  fVar3 = fVar3 - fVar9;
  fVar7 = fVar15 * fVar3 - (((fVar8 - fVar9 * fVar7) - fVar7 * fVar3) - fVar9 * fVar15);
  fVar15 = fVar10 + fVar7;
  fVar7 = (fVar10 - (fVar15 - (fVar15 - fVar10))) + (fVar7 - (fVar15 - fVar10));
  fVar10 = fVar8 + fVar15;
  fVar15 = fVar15 - (fVar10 - fVar8);
  fVar8 = splitter * fVar6 - (fVar2 + splitter * fVar6);
  fVar6 = fVar6 - fVar8;
  fVar14 = fVar12 * fVar6 - (((fVar5 - fVar14 * fVar8) - fVar12 * fVar8) - fVar14 * fVar6);
  fVar12 = fVar14 + fVar7;
  local_44 = (fVar7 - (fVar12 - (fVar12 - fVar7))) + (fVar14 - (fVar12 - fVar7));
  fVar2 = fVar15 + fVar12;
  fVar15 = (fVar15 - (fVar2 - (fVar2 - fVar15))) + (fVar12 - (fVar2 - fVar15));
  fVar14 = fVar10 + fVar2;
  fVar10 = (fVar10 - (fVar14 - (fVar14 - fVar10))) + (fVar2 - (fVar14 - fVar10));
  fVar9 = fVar6 * fVar3 - (((fVar4 - fVar9 * fVar8) - fVar8 * fVar3) - fVar9 * fVar6);
  fVar12 = fVar5 + fVar9;
  fVar3 = (fVar5 - (fVar12 - (fVar12 - fVar5))) + (fVar9 - (fVar12 - fVar5));
  fVar9 = fVar3 + fVar15;
  local_40 = (fVar15 - (fVar9 - (fVar9 - fVar15))) + (fVar3 - (fVar9 - fVar15));
  fVar3 = fVar10 + fVar9;
  fVar10 = (fVar10 - (fVar3 - (fVar3 - fVar10))) + (fVar9 - (fVar3 - fVar10));
  fVar15 = fVar14 + fVar3;
  fVar14 = (fVar14 - (fVar15 - (fVar15 - fVar14))) + (fVar3 - (fVar15 - fVar14));
  fVar9 = fVar4 + fVar12;
  fVar3 = (fVar4 - (fVar9 - (fVar9 - fVar4))) + (fVar12 - (fVar9 - fVar4));
  fVar12 = fVar3 + fVar10;
  local_3c = (fVar10 - (fVar12 - (fVar12 - fVar10))) + (fVar3 - (fVar12 - fVar10));
  fVar3 = fVar14 + fVar12;
  fVar14 = (fVar14 - (fVar3 - (fVar3 - fVar14))) + (fVar12 - (fVar3 - fVar14));
  fVar10 = fVar15 + fVar3;
  fVar15 = (fVar15 - (fVar10 - (fVar10 - fVar15))) + (fVar3 - (fVar10 - fVar15));
  fVar12 = fVar9 + fVar14;
  local_38 = (fVar14 - (fVar12 - (fVar12 - fVar14))) + (fVar9 - (fVar12 - fVar14));
  fVar14 = fVar15 + fVar12;
  local_34 = (fVar15 - (fVar14 - (fVar14 - fVar15))) + (fVar12 - (fVar14 - fVar15));
  local_2c = fVar10 + fVar14;
  local_30 = (fVar10 - (local_2c - (local_2c - fVar10))) + (fVar14 - (local_2c - fVar10));
  iVar1 = fast_expansion_sum_zeroelim(8,&local_28,8,&local_48,local_88);
  return local_88[(long)iVar1 + -1];
}

Assistant:

REAL orient2dslow(pa, pb, pc)
REAL *pa;
REAL *pb;
REAL *pc;
{
  INEXACT REAL acx, acy, bcx, bcy;
  REAL acxtail, acytail;
  REAL bcxtail, bcytail;
  REAL negate, negatetail;
  REAL axby[8], bxay[8];
  INEXACT REAL axby7, bxay7;
  REAL deter[16];
  int deterlen;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL a0hi, a0lo, a1hi, a1lo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j, _k, _l, _m, _n;
  REAL _0, _1, _2;

  Two_Diff(pa[0], pc[0], acx, acxtail);
  Two_Diff(pa[1], pc[1], acy, acytail);
  Two_Diff(pb[0], pc[0], bcx, bcxtail);
  Two_Diff(pb[1], pc[1], bcy, bcytail);

  Two_Two_Product(acx, acxtail, bcy, bcytail,
                  axby7, axby[6], axby[5], axby[4],
                  axby[3], axby[2], axby[1], axby[0]);
  axby[7] = axby7;
  negate = -acy;
  negatetail = -acytail;
  Two_Two_Product(bcx, bcxtail, negate, negatetail,
                  bxay7, bxay[6], bxay[5], bxay[4],
                  bxay[3], bxay[2], bxay[1], bxay[0]);
  bxay[7] = bxay7;

  deterlen = fast_expansion_sum_zeroelim(8, axby, 8, bxay, deter);

  return deter[deterlen - 1];
}